

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::ToNumber(Var aRight,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  double value;
  
  if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((ulong)aRight >> 0x32 != 0 || ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
    return aRight;
  }
  value = JavascriptConversion::ToNumber_Full(aRight,scriptContext);
  pvVar4 = JavascriptNumber::ToVarIntCheck(value,scriptContext);
  return pvVar4;
}

Assistant:

Var JavascriptOperators::ToNumber(Var aRight, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_ConvNumber_Full);
        if (TaggedInt::Is(aRight) || (JavascriptNumber::Is_NoTaggedIntCheck(aRight)))
        {
            return aRight;
        }

        return JavascriptNumber::ToVarIntCheck(JavascriptConversion::ToNumber_Full(aRight, scriptContext), scriptContext);
        JIT_HELPER_END(Op_ConvNumber_Full);
    }